

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

void __thiscall libtorrent::aux::directory::next(directory *this,error_code *ec)

{
  int *piVar1;
  dirent64 *pdVar2;
  
  ec->val_ = 0;
  ec->failed_ = false;
  ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category
  ;
  piVar1 = __errno_location();
  *piVar1 = 0;
  pdVar2 = readdir64((DIR *)this->m_handle);
  if (pdVar2 != (dirent64 *)0x0) {
    ::std::__cxx11::string::assign((char *)&this->m_name);
    return;
  }
  if (*piVar1 != 0) {
    boost::system::error_code::assign
              (ec,*piVar1,
               &boost::system::detail::cat_holder<void>::system_category_instance.
                super_error_category);
  }
  this->m_done = true;
  return;
}

Assistant:

void directory::next(error_code& ec)
	{
		ec.clear();
#ifdef TORRENT_WINDOWS
		if (FindNextFileW(m_handle, &m_fd) == 0)
		{
			m_done = true;
			int err = GetLastError();
			if (err != ERROR_NO_MORE_FILES)
				ec.assign(err, system_category());
		}
#else
		struct dirent* de;
		errno = 0;
		if ((de = ::readdir(m_handle)) != nullptr)
		{
			m_name = de->d_name;
		}
		else
		{
			if (errno) ec.assign(errno, system_category());
			m_done = true;
		}
#endif
	}